

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  int iVar1;
  bool bVar2;
  UnOpr op_00;
  BinOpr BVar3;
  int line_1;
  BinOpr nextop;
  expdesc v2;
  TString *usertype;
  int line;
  UnOpr uop;
  BinOpr op;
  int limit_local;
  expdesc *v_local;
  LexState *ls_local;
  
  enterlevel(ls);
  op_00 = getunopr((ls->t).token);
  if (op_00 == OPR_NOUNOPR) {
    simpleexp(ls,v);
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(ls->fs,"subexpr -> simpleexpr %e\n",v);
    }
  }
  else {
    iVar1 = ls->linenumber;
    v2.pc = 0;
    v2._52_4_ = 0;
    if (op_00 == OPR_TO_TYPE) {
      v2._48_8_ = (ls->t).seminfo;
      luaX_next(ls);
      v2._48_8_ = user_defined_type_name(ls,(TString *)v2._48_8_);
    }
    else {
      luaX_next(ls);
    }
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,op_00,v,iVar1,(TString *)v2._48_8_);
  }
  line = getbinopr((ls->t).token);
  while( true ) {
    bVar2 = false;
    if (line != 0x15) {
      bVar2 = limit < (int)(uint)priority[(uint)line].left;
    }
    if (!bVar2) break;
    memset(&line_1,0,0x38);
    v2.t = -1;
    v2.usertype._0_4_ = 0xffffffff;
    iVar1 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,line,v);
    BVar3 = subexpr(ls,(expdesc *)&line_1,(uint)priority[(uint)line].right);
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(ls->fs,"subexpr-> %e binop(%d) %e\n",v,(ulong)(uint)line,&line_1);
    }
    luaK_posfix(ls->fs,line,v,(expdesc *)&line_1,iVar1);
    line = BVar3;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(ls->fs,"subexpr-> after posfix %e\n",v);
    }
  }
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return line;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    int line = ls->linenumber;
	// RAVI change - get usertype if @<name>
    TString *usertype = NULL;
    if (uop == OPR_TO_TYPE) {
      usertype = ls->t.seminfo.ts;
      luaX_next(ls);
      // Check and expand to extended name if necessary
      usertype = user_defined_type_name(ls, usertype);
    }
    else {
      luaX_next(ls);
    }
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line, usertype);
  }
  else {
    simpleexp(ls, v);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr -> simpleexpr %e\n", v));
  }
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2 = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> %e binop(%d) %e\n", v, (int)op, &v2));
    
    luaK_posfix(ls->fs, op, v, &v2, line);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> after posfix %e\n", v));
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}